

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

bool execfile(char *cfgfile,bool msg)

{
  char *pcVar1;
  char *pcVar2;
  char *p;
  string s;
  
  copystring(s,cfgfile,0x104);
  pcVar2 = path(s);
  p = loadfile(pcVar2,(int *)0x0,true);
  pcVar1 = sourcestr;
  pcVar2 = sourcefile;
  if (p == (char *)0x0) {
    if (msg) {
      conoutf(4,"could not read \"%s\"",cfgfile);
    }
  }
  else {
    sourcefile = cfgfile;
    sourcestr = p;
    execute(p);
    sourcefile = pcVar2;
    sourcestr = pcVar1;
    operator_delete__(p);
  }
  return p != (char *)0x0;
}

Assistant:

bool execfile(const char *cfgfile, bool msg)
{
    string s;
    copystring(s, cfgfile);
    char *buf = loadfile(path(s), NULL);
    if(!buf)
    {
        if(msg) conoutf(CON_ERROR, "could not read \"%s\"", cfgfile);
        return false;
    }
    const char *oldsourcefile = sourcefile, *oldsourcestr = sourcestr;
    sourcefile = cfgfile;
    sourcestr = buf;
    execute(buf);
    sourcefile = oldsourcefile;
    sourcestr = oldsourcestr;
    delete[] buf;
    return true;
}